

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall
duckdb::HistogramBinState<unsigned_int>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<unsigned_int> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  size_type __n;
  long lVar1;
  vector<unsigned_int,_false> *this_00;
  pointer puVar2;
  unsafe_vector<unsigned_int> *puVar3;
  unsafe_vector<idx_t> *puVar4;
  ulong uVar5;
  UnifiedVectorFormat *pUVar6;
  BinderException *pBVar7;
  size_type sVar8;
  ulong uVar9;
  idx_t i;
  bool bVar10;
  allocator local_e1;
  uint local_e0 [8];
  UnifiedVectorFormat bin_child_data;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat bin_data;
  long local_70;
  long local_68;
  
  puVar3 = (unsafe_vector<unsigned_int> *)operator_new(0x18);
  (puVar3->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar3->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar3->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->bin_boundaries = puVar3;
  puVar4 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar4;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bin_data);
  duckdb::Vector::ToUnifiedFormat((ulong)bin_vector,(UnifiedVectorFormat *)count);
  if (*_bin_data != 0) {
    pos = (idx_t)*(uint *)(*_bin_data + pos * 4);
  }
  uVar9 = *(ulong *)(local_70 + pos * 0x10);
  __n = *(size_type *)(local_70 + 8 + pos * 0x10);
  if ((local_68 != 0) && ((*(ulong *)(local_68 + (pos >> 6) * 8) >> (pos & 0x3f) & 1) == 0)) {
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&bin_child_data,"Histogram bin list cannot be NULL",(allocator *)local_e0);
    duckdb::BinderException::BinderException(pBVar7,(string *)&bin_child_data);
    __cxa_throw(pBVar7,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = duckdb::ListVector::GetEntry(bin_vector);
  pUVar6 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(bin_vector);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bin_child_data);
  duckdb::Vector::ToUnifiedFormat(uVar5,pUVar6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->bin_boundaries->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,__n);
  sVar8 = __n;
  do {
    bVar10 = sVar8 == 0;
    sVar8 = sVar8 - 1;
    if (bVar10) {
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->bin_boundaries->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->bin_boundaries->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      uVar9 = 1;
      while( true ) {
        this_00 = this->bin_boundaries;
        puVar2 = (this_00->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_00->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar9) break;
        if (puVar2[uVar9 - 1] == puVar2[uVar9]) {
          vector<unsigned_int,_false>::unsafe_erase_at(this_00,uVar9);
          uVar9 = uVar9 - 1;
        }
        uVar9 = uVar9 + 1;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__n + 1)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_child_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_data);
      return;
    }
    lVar1 = *_bin_child_data;
    uVar5 = uVar9;
    if (lVar1 != 0) {
      uVar5 = (ulong)*(uint *)(lVar1 + uVar9 * 4);
    }
    if (local_b0 != 0) {
      if ((*(ulong *)(local_b0 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) == 0) {
        pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)local_e0,"Histogram bin entry cannot be NULL",&local_e1);
        duckdb::BinderException::BinderException(pBVar7,(string *)local_e0);
        __cxa_throw(pBVar7,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    uVar5 = uVar9;
    if (lVar1 != 0) {
      uVar5 = (ulong)*(uint *)(lVar1 + uVar9 * 4);
    }
    local_e0[0] = *(uint *)(local_b8 + uVar5 * 4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->bin_boundaries->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               local_e0);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}